

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::CallForVersion::CallForVersion(CallForVersion *this,string *msg,int exit_code)

{
  string local_78;
  allocator local_41;
  string local_40;
  int local_1c;
  string *psStack_18;
  int exit_code_local;
  string *msg_local;
  CallForVersion *this_local;
  
  local_1c = exit_code;
  psStack_18 = msg;
  msg_local = (string *)this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_40,"CallForVersion",&local_41);
  ::std::__cxx11::string::string((string *)&local_78,(string *)msg);
  Success::Success(&this->super_Success,&local_40,&local_78,local_1c);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_41);
  *(undefined ***)&(this->super_Success).super_ParseError.super_Error =
       &PTR__CallForVersion_001f6540;
  return;
}

Assistant:

CallForVersion()
        : CallForVersion("This should be caught in your main function, see examples", ExitCodes::Success) {}